

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::
     VectorArgMinMaxBase<duckdb::LessThan,false,(duckdb::OrderType)2,duckdb::SpecializedGenericArgMinMaxState>
     ::
     Combine<duckdb::ArgMinMaxState<duckdb::string_t,duckdb::hugeint_t>,duckdb::VectorArgMinMaxBase<duckdb::LessThan,false,(duckdb::OrderType)2,duckdb::SpecializedGenericArgMinMaxState>>
               (ArgMinMaxState<duckdb::string_t,_duckdb::hugeint_t> *source,
               ArgMinMaxState<duckdb::string_t,_duckdb::hugeint_t> *target,
               AggregateInputData *param_3)

{
  string_t new_value;
  bool bVar1;
  string_t *in_RSI;
  byte *in_RDI;
  hugeint_t new_value_00;
  undefined8 unaff_retaddr;
  hugeint_t *in_stack_ffffffffffffffc8;
  hugeint_t *in_stack_ffffffffffffffd0;
  
  if (((*in_RDI & 1) != 0) &&
     (((undefined1  [16])((undefined1  [16])in_RSI->value & (undefined1  [16])0x1) ==
       (undefined1  [16])0x0 ||
      (bVar1 = LessThan::Operation<duckdb::hugeint_t>
                         (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8), bVar1)))) {
    new_value_00.upper = (int64_t)*(hugeint_t **)(in_RDI + 0x18);
    new_value_00.lower = *(uint64_t *)(in_RDI + 0x20);
    ArgMinMaxStateBase::AssignValue<duckdb::hugeint_t>
              ((ArgMinMaxStateBase *)((long)&in_RSI[1].value + 8),*(hugeint_t **)(in_RDI + 0x18),
               new_value_00);
    *(byte *)((long)&in_RSI->value + 1) = in_RDI[1] & 1;
    if ((undefined1  [16])((undefined1  [16])in_RSI->value & (undefined1  [16])0x100) ==
        (undefined1  [16])0x0) {
      new_value.value.pointer.ptr = (char *)unaff_retaddr;
      new_value.value._0_8_ = in_RDI;
      ArgMinMaxStateBase::AssignValue<duckdb::string_t>(in_RSI,new_value);
    }
    *(undefined1 *)&in_RSI->value = 1;
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_initialized) {
			return;
		}
		if (!target.is_initialized || COMPARATOR::Operation(source.value, target.value)) {
			STATE::template AssignValue<typename STATE::BY_TYPE>(target.value, source.value);
			target.arg_null = source.arg_null;
			if (!target.arg_null) {
				STATE::template AssignValue<typename STATE::ARG_TYPE>(target.arg, source.arg);
			}
			target.is_initialized = true;
		}
	}